

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

char * Wln_ObjConstString(Wln_Ntk_t *p,int iObj)

{
  Abc_Nam_t *p_00;
  int iVar1;
  char *pcVar2;
  int iObj_local;
  Wln_Ntk_t *p_local;
  
  iVar1 = Wln_ObjIsConst(p,iObj);
  if (iVar1 != 0) {
    p_00 = p->pManName;
    iVar1 = Wln_ObjFanin0(p,iObj);
    pcVar2 = Abc_NamStr(p_00,iVar1);
    return pcVar2;
  }
  __assert_fail("Wln_ObjIsConst(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                ,0x37,"char *Wln_ObjConstString(Wln_Ntk_t *, int)");
}

Assistant:

char * Wln_ObjConstString( Wln_Ntk_t * p, int iObj )
{
    assert( Wln_ObjIsConst(p, iObj) );
    return Abc_NamStr( p->pManName, Wln_ObjFanin0(p, iObj) );
}